

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

bool auto_check_multi(DESCRIPTOR_DATA *d_check,char *host)

{
  bool bVar1;
  char *in_RSI;
  DESCRIPTOR_DATA *in_RDI;
  DESCRIPTOR_DATA *d;
  DESCRIPTOR_DATA *local_20;
  
  local_20 = descriptor_list;
  while( true ) {
    if (local_20 == (DESCRIPTOR_DATA *)0x0) {
      return false;
    }
    if (((local_20 != in_RDI) && (local_20->character != (CHAR_DATA *)0x0)) &&
       (bVar1 = str_cmp(in_RSI,local_20->host), !bVar1)) break;
    local_20 = local_20->next;
  }
  return true;
}

Assistant:

bool auto_check_multi(DESCRIPTOR_DATA *d_check, char *host)
{
	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == d_check || d->character == nullptr)
			continue;

		if (!str_cmp(host, d->host))
			return true;
	}

	return false;
}